

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::ForwardDynamicsApplyConstraintForces
               (Model *model,VectorNd *Tau,ConstraintSet *CS,VectorNd *QDDot)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  pointer pSVar5;
  pointer pJVar6;
  double *pdVar7;
  pointer pSVar8;
  ResScalar RVar9;
  double dVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  SpatialVector *mv;
  long lVar15;
  pointer pSVar16;
  SpatialTransform *pSVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  long local_418;
  pointer local_400;
  VectorNd *local_3f8;
  VectorNd *local_3f0;
  long local_3e8;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
  *local_3e0;
  SpatialMatrix *local_3d8;
  SpatialMatrix *local_3d0;
  undefined1 local_3c8 [24];
  scalar_constant_op<double> local_3b0;
  double local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  double local_388;
  double local_370;
  SpatialVector pa;
  SpatialMatrix Ia;
  Vector3d qdd_temp;
  
  bVar21 = 0;
  uVar14 = 1;
  local_3f8 = Tau;
  local_3f0 = QDDot;
  while( true ) {
    uVar13 = ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->mBodies).
                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    if (uVar13 <= uVar14) break;
    Math::SpatialRigidBodyInertia::toMatrix
              (&Ia,(model->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14);
    memcpy((model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
           super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar14,&Ia,0x120);
    mv = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
         super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
         super__Vector_impl_data._M_start + uVar14;
    Math::SpatialRigidBodyInertia::operator*
              ((SpatialVector *)local_3c8,
               (model->I).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,mv);
    Math::crossf(mv,(SpatialVector *)local_3c8);
    pSVar5 = (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar7 = (double *)
             ((long)&pSVar5[uVar14].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
    *pdVar7 = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4]
    ;
    pdVar7[1] = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [5];
    pdVar7 = (double *)
             ((long)&pSVar5[uVar14].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
    *pdVar7 = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
    ;
    pdVar7[1] = Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [3];
    *(double *)
     &pSVar5[uVar14].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar5[uVar14].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
         Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
    bVar12 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator!=
                       ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)
                        (*(long *)(CS + 0x238) + uVar14 * 0x30),
                        (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)Math::SpatialVectorZero
                       );
    if (bVar12) {
      Math::SpatialTransform::toMatrixAdjoint
                (&Ia,(model->X_base).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar14);
      local_3c8._8_8_ = *(long *)(CS + 0x238) + uVar14 * 0x30;
      local_3c8._0_8_ = &Ia;
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)
                 ((model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar14),
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)local_3c8);
    }
    uVar14 = (ulong)((int)uVar14 + 1);
  }
  uVar14 = (ulong)((int)uVar13 - 1);
  lVar19 = uVar14 * 0x60;
  lVar20 = uVar14 * 0x30;
  lVar15 = uVar14 * 0x120;
  lVar18 = uVar14 * 0x18;
  local_3e8 = uVar14 * 0x48;
  local_418 = uVar14 * 0x90;
  do {
    if ((int)uVar14 == 0) {
      dVar1 = (model->gravity).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      pSVar5 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar2 = (model->gravity).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      dVar10 = (model->gravity).super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
      *(double *)
       ((long)&(pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
      *(undefined8 *)
       &(pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&(pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      *(double *)
       ((long)&(pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = -dVar2;
      *(double *)
       ((long)&(pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = -dVar10;
      *(double *)
       ((long)&(pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = -dVar1;
      uVar14 = 1;
      while( true ) {
        if ((ulong)(((long)(model->mBodies).
                           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model->mBodies).
                          super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar14) break;
        uVar3 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14].q_index;
        uVar4 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar14];
        pSVar8 = (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar16 = pSVar8 + uVar14;
        pSVar17 = (SpatialTransform *)&Ia;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[0] = *(double *)&(pSVar16->E).super_Matrix3d;
          pSVar16 = (pointer)((long)pSVar16 + ((ulong)bVar21 * -2 + 1) * 8);
          pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar21 * -0x10 + 8);
        }
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
             *(double *)((long)&pSVar8[uVar14].r.super_Vector3d + 0x10);
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
             *(double *)
              &pSVar8[uVar14].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
        Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
             *(double *)
              ((long)&pSVar8[uVar14].r.super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
        Math::SpatialTransform::apply
                  ((SpatialTransform *)&Ia,
                   (model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar4);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1] =
             (double)((model->c).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar14);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] = (double)local_3c8;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                  (&(model->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].
                    super_Matrix<double,_6,_1,_0,_6,_1>,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                    *)&qdd_temp);
        if ((model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14].mDoFCount == 3) {
          local_3c8._0_8_ =
               (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar14;
          local_3c8._8_8_ =
               (model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl
               .super__Vector_impl_data._M_start + uVar14;
          local_3c8._16_8_ =
               (model->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14;
          local_3b0.m_other =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar14);
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
          _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&qdd_temp,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                      *)local_3c8);
          pdVar7 = (local_3f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          pdVar7[uVar3] =
               qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
          pdVar7[uVar3 + 1] =
               qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1];
          pdVar7[uVar3 + 2] =
               qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
          local_3c8._0_8_ =
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar14;
          local_3c8._8_8_ =
               (model->multdof3_S).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14;
          local_3c8._16_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&qdd_temp;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((Matrix<double,_6,_1,_0,_6,_1> *)local_3c8._0_8_,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)local_3c8);
        }
        else {
          dVar1 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[uVar14];
          dVar2 = (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[uVar14];
          RVar9 = Eigen::internal::
                  dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
                  ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                        ((model->U).
                         super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                         super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14),
                        (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                        ((model->a).
                         super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                         super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14));
          local_3b0.m_other = (dVar2 - RVar9) * (1.0 / dVar1);
          (local_3f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_data[uVar3] = local_3b0.m_other;
          local_3c8._0_8_ =
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar14;
          local_3c8._8_8_ =
               (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar14;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                    ((Matrix<double,_6,_1,_0,_6,_1> *)local_3c8._0_8_,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                      *)local_3c8);
        }
        uVar14 = (ulong)((int)uVar14 + 1);
      }
      return;
    }
    pJVar6 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = *(uint *)((long)&pJVar6->q_index + lVar18);
    if (*(int *)((long)&pJVar6->mDoFCount + lVar18) == 3) {
      uVar13 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
      pdVar7 = (local_3f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      local_3c8._0_8_ = pdVar7[uVar3];
      local_3c8._8_8_ = pdVar7[uVar3 + 1];
      local_3c8._16_8_ = pdVar7[uVar3 + 2];
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
           (double)((long)&(((model->multdof3_S).
                             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             .
                             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
                   local_418);
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
           (double)((long)&(((model->pA).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20);
      Ia.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)local_3c8;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 ((long)&(((model->multdof3_u).
                           super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
                           super__Vector_impl_data._M_start)->super_Vector3d).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
                 lVar18),(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                          *)&Ia);
      lVar11 = local_3e8;
      if (uVar13 != 0) {
        local_3c8._0_8_ =
             (long)&(((model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_Matrix<double,_6,_6,_0,_6,_6>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar15;
        local_3c8._8_8_ =
             (long)&(((model->multdof3_U).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
             local_418;
        local_3c8._16_8_ =
             (long)&(((model->multdof3_Dinv).
                      super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_Matrix3d).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
             local_3e8;
        local_3b0.m_other = (double)local_3c8._8_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                    *)local_3c8);
        local_3c8._8_8_ =
             (long)&(((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20;
        local_3b0.m_other =
             (double)((long)&(((model->c).
                               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               .
                               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20);
        local_3a0 = (long)&(((model->multdof3_U).
                             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             .
                             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
                    local_418;
        local_398 = (long)&(((model->multdof3_Dinv).
                             super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                             super__Vector_impl_data._M_start)->super_Matrix3d).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                    lVar11;
        local_390 = (long)&(((model->multdof3_u).
                             super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
                             super__Vector_impl_data._M_start)->super_Vector3d).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
                    lVar18;
        local_3c8._16_8_ = &Ia;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&pa,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)local_3c8);
        Math::SpatialTransform::toMatrixTranspose
                  ((SpatialMatrix *)local_3c8,
                   (SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar19)
                  );
        Math::SpatialTransform::toMatrix
                  ((SpatialMatrix *)&qdd_temp,
                   (SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar19)
                  );
        local_3d8 = &Ia;
        local_400 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar13;
        local_3e0 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                     *)local_3c8;
        local_3d0 = (SpatialMatrix *)&qdd_temp;
        Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase> *)&local_400,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                    *)&local_3e0);
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar19)
                   ,&pa);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
LAB_00114882:
        Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase> *)&qdd_temp,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_3c8);
      }
    }
    else {
      dVar1 = (local_3f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data[uVar3];
      RVar9 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                    ((long)&(((model->S).
                              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              .
                              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20),
                    (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                    ((long)&(((model->pA).
                              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              .
                              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20));
      (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar14] = dVar1 - RVar9;
      uVar13 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
      if (uVar13 != 0) {
        local_3c8._0_8_ =
             (long)&(((model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_Matrix<double,_6,_6,_0,_6,_6>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar15;
        local_3c8._8_8_ =
             (long)&(((model->U).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20;
        local_3a8 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar14];
        local_3c8._16_8_ = local_3c8._8_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                    *)local_3c8);
        local_3c8._8_8_ =
             (long)&(((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20;
        local_3b0.m_other =
             (double)((long)&(((model->c).
                               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               .
                               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20);
        local_398 = (long)&(((model->U).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20;
        local_388 = (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar14];
        local_370 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar14];
        local_3c8._16_8_ = (PlainObjectBase<Eigen::Matrix<double,6,6,0,6,6>> *)&Ia;
        Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&pa,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)local_3c8);
        Math::SpatialTransform::toMatrixTranspose
                  ((SpatialMatrix *)local_3c8,
                   (SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar19)
                  );
        Math::SpatialTransform::toMatrix
                  ((SpatialMatrix *)&qdd_temp,
                   (SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar19)
                  );
        local_3d8 = &Ia;
        local_400 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar13;
        local_3e0 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                     *)local_3c8;
        local_3d0 = (SpatialMatrix *)&qdd_temp;
        Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase> *)&local_400,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                    *)&local_3e0);
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar19)
                   ,&pa);
        qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
        goto LAB_00114882;
      }
    }
    uVar14 = uVar14 - 1;
    lVar19 = lVar19 + -0x60;
    lVar20 = lVar20 + -0x30;
    lVar15 = lVar15 + -0x120;
    lVar18 = lVar18 + -0x18;
    local_3e8 = local_3e8 + -0x48;
    local_418 = local_418 + -0x90;
  } while( true );
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsApplyConstraintForces (
		Model &model,
		const VectorNd &Tau,
		ConstraintSet &CS,
		VectorNd &QDDot
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;
	assert (QDDot.size() == model.dof_count);

	unsigned int i = 0;

	for (i = 1; i < model.mBodies.size(); i++) {
		model.IA[i] = model.I[i].toMatrix();;
		model.pA[i] = crossf(model.v[i],model.I[i] * model.v[i]);

		if (CS.f_ext_constraints[i] != SpatialVectorZero) {
			LOG << "External force (" << i << ") = " << model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i] << std::endl;
			model.pA[i] -= model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i];
		}
	}

// ClearLogOutput();

	LOG << "--- first loop ---" << std::endl;

	for (i = model.mBodies.size() - 1; i > 0; i--) {
		unsigned int q_index = model.mJoints[i].q_index;

		if (model.mJoints[i].mDoFCount == 3) {
			unsigned int lambda = model.lambda[i];

			model.multdof3_u[i] = Vector3d (Tau[q_index], Tau[q_index + 1], Tau[q_index + 2]) - model.multdof3_S[i].transpose() * model.pA[i];

			if (lambda != 0) {
				SpatialMatrix Ia = model.IA[i] - model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_U[i].transpose();
				SpatialVector pa = model.pA[i] + Ia * model.c[i] + model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_u[i];
#ifdef EIGEN_CORE_H
				model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#else
				model.IA[lambda] += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#endif
				LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose() << std::endl;
			}
		} else {
			model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				SpatialMatrix Ia = model.IA[i] - model.U[i] * (model.U[i] / model.d[i]).transpose();
				SpatialVector pa = model.pA[i] + Ia * model.c[i] + model.U[i] * model.u[i] / model.d[i];
#ifdef EIGEN_CORE_H
				model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#else
				model.IA[lambda] += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#endif
				LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose() << std::endl;
			}
		}
	}
	
	model.a[0] = SpatialVector (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

	for (i = 1; i < model.mBodies.size(); i++) {
		unsigned int q_index = model.mJoints[i].q_index;
		unsigned int lambda = model.lambda[i];
		SpatialTransform X_lambda = model.X_lambda[i];

		model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
		LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

		if (model.mJoints[i].mDoFCount == 3) {
			Vector3d qdd_temp = model.multdof3_Dinv[i] * (model.multdof3_u[i] - model.multdof3_U[i].transpose() * model.a[i]);
			QDDot[q_index] = qdd_temp[0];
			QDDot[q_index + 1] = qdd_temp[1];
			QDDot[q_index + 2] = qdd_temp[2];
			model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
		} else {
			QDDot[q_index] = (1./model.d[i]) * (model.u[i] - model.U[i].dot(model.a[i]));
			model.a[i] = model.a[i] + model.S[i] * QDDot[q_index];
		}
	}

	LOG << "QDDot = " << QDDot.transpose() << std::endl;
}